

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingEnums.cpp
# Opt level: O1

int main(void)

{
  SessionWriter *this;
  pthread_mutex_t *ppVar1;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> aVar3;
  int iVar4;
  size_t sVar5;
  Session *pSVar6;
  undefined8 uVar7;
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  long lVar8;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_03;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_04;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_08;
  PartiallyAdaptedEnum *in_R9;
  char *__end;
  long *in_FS_OFFSET;
  timespec ts;
  undefined1 local_488 [136];
  PartiallyAdaptedEnum local_400 [2];
  pointer local_3f8;
  char acStack_3f0 [7];
  uint uStack_3e9;
  uint uStack_3e5;
  char cStack_3d9;
  char local_3d8;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  uint64_t local_358;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [16];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  uint64_t local_2a0;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [16];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  uint64_t local_1e8;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint64_t local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
    main_cold_1();
    in_RDX = extraout_RDX_04;
  }
  this = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (0x80 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
LAB_00102b04:
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
      main_cold_4();
      in_RDX = extraout_RDX_05;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488)
          ;
          main_cold_5();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_1a0._0_8_ = 0;
        local_1a0._8_2_ = info;
        local_190._M_p = (pointer)&local_180;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
        local_170._M_p = (pointer)&local_160;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
        local_150._M_p = (pointer)&local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                   ,"");
        local_130 = 0x2c;
        local_128._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Adapted enum: {}","");
        mserialize::CustomTag<AdaptedEnum,_void>::tag_string();
        local_3d8 = '\0';
        local_3f8 = (pointer)local_488._0_8_;
        acStack_3f0[0] = local_488[8];
        acStack_3f0[1] = local_488[9];
        acStack_3f0[2] = local_488[10];
        acStack_3f0[3] = local_488[0xb];
        acStack_3f0[4] = local_488[0xc];
        acStack_3f0[5] = local_488[0xd];
        acStack_3f0[6] = local_488[0xe];
        uStack_3e9 = local_488._15_4_;
        uStack_3e5 = local_488._19_4_;
        cStack_3d9 = local_488[0x1f];
        local_108._M_p = (pointer)&local_f8;
        sVar5 = strlen((char *)&local_3f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,&local_3f8,(long)&local_3f8 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_001039da;
        local_1a0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_1a0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_p != &local_118) {
          operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
        main_cold_6();
      }
      local_488._0_8_ = (pointer)0x0;
      local_488[8] = '\0';
      local_488[9] = '\0';
      local_488[10] = '\0';
      local_488[0xb] = '\0';
      local_488[0xc] = '\0';
      local_488[0xd] = '\0';
      local_488[0xe] = '\0';
      local_488._15_4_ = local_488._15_4_ & 0xffffff00;
      clock_gettime(0,(timespec *)local_488);
      lVar8 = local_488._0_8_ * 1000000000;
      local_488._0_4_ = 1;
      binlog::SessionWriter::addEvent<AdaptedEnum>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 lVar8 + CONCAT17(local_488[0xf],local_488._8_7_),(AdaptedEnum *)local_488);
      in_RDX = extraout_RDX_00;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
      main_cold_7();
      in_RDX = extraout_RDX_06;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488)
          ;
          main_cold_8();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_258._0_8_ = 0;
        local_258._8_2_ = info;
        local_248._M_p = (pointer)&local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"main","");
        local_228._M_p = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"main","");
        local_208._M_p = (pointer)&local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                   ,"");
        local_1e8 = 0x32;
        local_1e0._M_p = (pointer)&local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Scoped enum: {}","");
        mserialize::CustomTag<ScopedEnum,_void>::tag_string();
        cStack_3d9 = '\0';
        local_3f8 = (pointer)local_488._0_8_;
        acStack_3f0[0] = local_488[8];
        acStack_3f0[1] = local_488[9];
        acStack_3f0[2] = local_488[10];
        acStack_3f0[3] = local_488[0xb];
        acStack_3f0[4] = local_488[0xc];
        acStack_3f0[5] = local_488[0xd];
        acStack_3f0[6] = local_488[0xe];
        uStack_3e9 = local_488._15_4_;
        uStack_3e5 = local_488._19_4_;
        local_1c0._M_p = (pointer)&local_1b0;
        sVar5 = strlen((char *)&local_3f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,&local_3f8,(long)&local_3f8 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_001039e1;
        local_258._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_258,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_p != &local_1b0) {
          operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_p != &local_1d0) {
          operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_p != &local_1f8) {
          operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_p != &local_218) {
          operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_p != &local_238) {
          operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
        main_cold_9();
      }
      local_488._0_8_ = (pointer)0x0;
      local_488[8] = '\0';
      local_488[9] = '\0';
      local_488[10] = '\0';
      local_488[0xb] = '\0';
      local_488[0xc] = '\0';
      local_488[0xd] = '\0';
      local_488[0xe] = '\0';
      local_488._15_4_ = local_488._15_4_ & 0xffffff00;
      clock_gettime(0,(timespec *)local_488);
      lVar8 = local_488._0_8_ * 1000000000;
      local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
      binlog::SessionWriter::addEvent<ScopedEnum>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 lVar8 + CONCAT17(local_488[0xf],local_488._8_7_),(ScopedEnum *)local_488);
      in_RDX = extraout_RDX_01;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
      main_cold_10();
      in_RDX = extraout_RDX_07;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488)
          ;
          main_cold_11();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_310._0_8_ = 0;
        local_310._8_2_ = info;
        local_300._M_p = (pointer)&local_2f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"main","");
        local_2e0._M_p = (pointer)&local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"main","");
        local_2c0._M_p = (pointer)&local_2b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                   ,"");
        local_2a0 = 0x37;
        local_298._M_p = (pointer)&local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"Partially adapted enum: {} {} {}","");
        local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x14);
        local_400[0] = Sigma;
        local_400[1] = 0x28;
        binlog::detail::
        concatenated_tags<char_const(&)[33],PartiallyAdaptedEnum,PartiallyAdaptedEnum,PartiallyAdaptedEnum>
                  ((cx_string<123UL> *)local_488,(detail *)"Partially adapted enum: {} {} {}",
                   (char (*) [33])&local_3f8,local_400,local_400 + 1,in_R9);
        local_278._M_p = (pointer)&local_268;
        sVar5 = strlen(local_488);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,local_488,local_488 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_001039e8;
        local_310._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_310,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_p != &local_288) {
          operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_p != &local_2b0) {
          operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_p != &local_2d0) {
          operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_p != &local_2f0) {
          operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
        main_cold_12();
      }
      local_488._0_8_ = (pointer)0x0;
      local_488[8] = '\0';
      local_488[9] = '\0';
      local_488[10] = '\0';
      local_488[0xb] = '\0';
      local_488[0xc] = '\0';
      local_488[0xd] = '\0';
      local_488[0xe] = '\0';
      local_488._15_4_ = local_488._15_4_ & 0xffffff00;
      clock_gettime(0,(timespec *)local_488);
      lVar8 = local_488._0_8_ * 1000000000;
      local_488._0_4_ = 0x14;
      local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x1e);
      local_400[0] = Tau;
      binlog::SessionWriter::
      addEvent<PartiallyAdaptedEnum,PartiallyAdaptedEnum,PartiallyAdaptedEnum>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 lVar8 + CONCAT17(local_488[0xf],local_488._8_7_),(PartiallyAdaptedEnum *)local_488,
                 (PartiallyAdaptedEnum *)&local_3f8,local_400);
      in_RDX = extraout_RDX_02;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
      main_cold_13();
      in_RDX = extraout_RDX_08;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488)
          ;
          main_cold_14();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_3c8._0_8_ = 0;
        local_3c8._8_2_ = info;
        local_3b8._M_p = (pointer)&local_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"main","");
        local_398._M_p = (pointer)&local_388;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"main","");
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_378,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                   ,"");
        local_358 = 0x3a;
        local_350._M_p = (pointer)&local_340;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_350,"Shadowed enum type: {}","");
        mserialize::CustomTag<Nest::Nested,_void>::tag_string();
        uStack_3e5 = uStack_3e5 & 0xffffff00;
        local_3f8 = (pointer)local_488._0_8_;
        acStack_3f0[0] = local_488[8];
        acStack_3f0[1] = local_488[9];
        acStack_3f0[2] = local_488[10];
        acStack_3f0[3] = local_488[0xb];
        acStack_3f0[4] = local_488[0xc];
        acStack_3f0[5] = local_488[0xd];
        acStack_3f0[6] = local_488[0xe];
        uStack_3e9 = local_488._15_4_;
        local_330._M_p = (pointer)&local_320;
        sVar5 = strlen((char *)&local_3f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,&local_3f8,(long)&local_3f8 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_001039ef;
        local_3c8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_3c8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_p != &local_340) {
          operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_p != &local_388) {
          operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
        main_cold_15();
      }
      local_488._0_8_ = (pointer)0x0;
      local_488[8] = '\0';
      local_488[9] = '\0';
      local_488[10] = '\0';
      local_488[0xb] = '\0';
      local_488[0xc] = '\0';
      local_488[0xd] = '\0';
      local_488[0xe] = '\0';
      local_488._15_4_ = local_488._15_4_ & 0xffffff00;
      clock_gettime(0,(timespec *)local_488);
      lVar8 = local_488._0_8_ * 1000000000;
      local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
      binlog::SessionWriter::addEvent<Nest::Nested>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 lVar8 + CONCAT17(local_488[0xf],local_488._8_7_),(Nested *)local_488);
      in_RDX = extraout_RDX_03;
    }
    binlog::consume<std::ostream>((ConsumeResult *)local_488,(binlog *)&std::cout,in_RDX);
    return 0;
  }
  if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_00102abd:
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
      main_cold_3();
    }
    local_488._0_8_ = (pointer)0x0;
    local_488[8] = '\0';
    local_488[9] = '\0';
    local_488[10] = '\0';
    local_488[0xb] = '\0';
    local_488[0xc] = '\0';
    local_488[0xd] = '\0';
    local_488[0xe] = '\0';
    local_488._15_4_ = local_488._15_4_ & 0xffffff00;
    clock_gettime(0,(timespec *)local_488);
    lVar8 = local_488._0_8_ * 1000000000;
    local_488._0_4_ = 0x7b;
    binlog::SessionWriter::addEvent<Enum>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               lVar8 + CONCAT17(local_488[0xf],local_488._8_7_),(Enum *)local_488);
    in_RDX = extraout_RDX;
    goto LAB_00102b04;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_488);
    main_cold_2();
  }
  ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
  local_e8._0_8_ = 0;
  local_e8._8_2_ = info;
  local_d8._M_p = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
  local_98._M_p = (pointer)&local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
             ,"");
  local_78 = 0x26;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Enum: {}","");
  local_488._0_2_ = 0x49;
  local_50._M_p = (pointer)&local_40;
  sVar5 = strlen(local_488);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_488,local_488 + sVar5);
  iVar4 = pthread_mutex_lock(ppVar1);
  if (iVar4 == 0) {
    local_e8._0_8_ = ppVar1[3].__align;
    binlog::
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
    _Var2._M_i = ppVar1[3].__align;
    ppVar1[3].__align = _Var2._M_i + 1;
    pthread_mutex_unlock(ppVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    LOCK();
    UNLOCK();
    main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    goto LAB_00102abd;
  }
  iVar4 = std::__throw_system_error(iVar4);
LAB_001039da:
  iVar4 = std::__throw_system_error(iVar4);
LAB_001039e1:
  iVar4 = std::__throw_system_error(iVar4);
LAB_001039e8:
  iVar4 = std::__throw_system_error(iVar4);
LAB_001039ef:
  uVar7 = std::__throw_system_error(iVar4);
  if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
    operator_delete((void *)local_488._0_8_,
                    CONCAT17(local_488[0x17],CONCAT43(local_488._19_4_,local_488._16_3_)) + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

int main()
{
  //[basic
  BINLOG_INFO("Enum: {}", Alpha);
  // Outputs: Enum: 123
  //]

  //[adapted

  BINLOG_INFO("Adapted enum: {}", Delta);
  // Outputs: Adapted enum: Delta
  //]

  //[scoped

  BINLOG_INFO("Scoped enum: {}", ScopedEnum::Epsilon);
  // Outputs: Scoped enum: Epsilon

  //]

  BINLOG_INFO("Partially adapted enum: {} {} {}", Rho, Sigma, Tau);
  // Outputs: Partially adapted enum: Rho Sigma 0x28

  BINLOG_INFO("Shadowed enum type: {}", Nest::Nested::Bird);
  // Outputs: Shadowed enum type: Bird

  binlog::consume(std::cout);
  return 0;
}